

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Print
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,ostream *out)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  TPZNodeRep<3,_pztopology::TPZTriangle>::Print((TPZNodeRep<3,_pztopology::TPZTriangle> *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Neighbours/transformations used for mapping the sides :\n",0x38);
  iVar3 = 3;
  lVar5 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(out,"Side: ",6);
    poVar2 = (ostream *)std::ostream::operator<<(out,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," El/side: ",10);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    iVar1 = *(int *)((long)&this->fNeighbours[0].fSide + lVar5);
    iVar4 = iVar1;
    if (*(long *)((long)&this->fNeighbours[0].fGeoElIndex + lVar5) == -1) {
      iVar4 = -1;
    }
    if (iVar1 == -1) {
      iVar4 = iVar1;
    }
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
    iVar3 = iVar3 + 1;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x60);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Print(std::ostream &out) const
{
	TGeo::Print(out);
	out << "Neighbours/transformations used for mapping the sides :\n";
	int is;
	for(is=TGeo::NNodes; is<TGeo::NSides; is++)
	{
        out << "Side: " << is << " El/side: " << fNeighbours[is-TGeo::NNodes].ElementIndex() << ":" <<
        fNeighbours[is-TGeo::NNodes].Side() << '\n';
	}
}